

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_doc_comment.cc
# Opt level: O0

void google::protobuf::compiler::csharp::WritePropertyDocComment
               (Printer *printer,FieldDescriptor *field)

{
  FieldDescriptor *field_local;
  Printer *printer_local;
  
  WriteDocCommentBody<google::protobuf::FieldDescriptor>(printer,field);
  return;
}

Assistant:

void WritePropertyDocComment(io::Printer* printer, const FieldDescriptor* field) {
    WriteDocCommentBody(printer, field);
}